

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3Codec.cpp
# Opt level: O0

string * __thiscall
AC3Codec::getStreamInfo_abi_cxx11_(string *__return_storage_ptr__,AC3Codec *this)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  uint local_1c0;
  int channels;
  string local_1b0 [8];
  string hd_type;
  ostringstream str;
  AC3Codec *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(hd_type.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_1b0);
  if ((this->mlp).m_subType == stTRUEHD) {
    std::__cxx11::string::operator=(local_1b0,"TRUE-HD");
  }
  else {
    pcVar3 = "UNKNOWN";
    if ((this->mlp).m_subType == stMLP) {
      pcVar3 = "MLP";
    }
    std::__cxx11::string::operator=(local_1b0,pcVar3);
  }
  if ((this->m_true_hd_mode & 1U) == 0) {
    bVar1 = isEAC3(this);
    if (bVar1) {
      std::operator<<((ostream *)(hd_type.field_2._M_local_buf + 8),"EAC3 ");
    }
    if ((this->m_isAtmos & 1U) != 0) {
      std::operator<<((ostream *)(hd_type.field_2._M_local_buf + 8),"+ ATMOS, ");
    }
    poVar2 = std::operator<<((ostream *)(hd_type.field_2._M_local_buf + 8),"Bitrate: ");
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,(this->m_bit_rate + this->m_bit_rateExt) / 1000);
    std::operator<<(poVar2,"Kbps ");
    if (this->m_bit_rateExt != 0) {
      poVar2 = std::operator<<((ostream *)(hd_type.field_2._M_local_buf + 8),"(core ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_bit_rate / 1000);
      std::operator<<(poVar2,"Kbps) ");
    }
    poVar2 = std::operator<<((ostream *)(hd_type.field_2._M_local_buf + 8),"Sample Rate: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_sample_rate / 1000);
    std::operator<<(poVar2,"KHz ");
  }
  else {
    bVar1 = isEAC3(this);
    if (bVar1) {
      std::operator<<((ostream *)(hd_type.field_2._M_local_buf + 8),"E");
    }
    std::operator<<((ostream *)(hd_type.field_2._M_local_buf + 8),"AC3 core + ");
    std::operator<<((ostream *)(hd_type.field_2._M_local_buf + 8),local_1b0);
    if ((this->mlp).m_substreams == '\x04') {
      std::operator<<((ostream *)(hd_type.field_2._M_local_buf + 8)," + ATMOS");
    }
    std::operator<<((ostream *)(hd_type.field_2._M_local_buf + 8),". ");
    poVar2 = std::operator<<((ostream *)(hd_type.field_2._M_local_buf + 8),"Peak bitrate: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->mlp).m_bitrate / 1000);
    poVar2 = std::operator<<(poVar2,"Kbps (core ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_bit_rate / 1000);
    std::operator<<(poVar2,"Kbps) ");
    poVar2 = std::operator<<((ostream *)(hd_type.field_2._M_local_buf + 8),"Sample Rate: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->mlp).m_samplerate / 1000);
    std::operator<<(poVar2,"KHz ");
    if (this->m_sample_rate != (this->mlp).m_samplerate) {
      poVar2 = std::operator<<((ostream *)(hd_type.field_2._M_local_buf + 8)," (core ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_sample_rate / 1000);
      std::operator<<(poVar2,"Khz) ");
    }
  }
  std::operator<<((ostream *)(hd_type.field_2._M_local_buf + 8),"Channels: ");
  local_1c0 = (uint)this->m_channels;
  if ((this->m_extChannelsExists & 1U) != 0) {
    local_1c0 = local_1c0 + 2;
  }
  if ((this->mlp).m_channels != '\0') {
    local_1c0 = (uint)(this->mlp).m_channels;
  }
  if (this->m_lfeon == '\0') {
    std::ostream::operator<<((ostream *)(hd_type.field_2._M_local_buf + 8),local_1c0);
  }
  else {
    poVar2 = (ostream *)
             std::ostream::operator<<((ostream *)(hd_type.field_2._M_local_buf + 8),local_1c0 - 1);
    std::operator<<(poVar2,".1");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(hd_type.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

const std::string AC3Codec::getStreamInfo()
{
    std::ostringstream str;
    std::string hd_type;
    if (mlp.m_subType == MlpSubType::stTRUEHD)
        hd_type = "TRUE-HD";
    else
        hd_type = (mlp.m_subType == MlpSubType::stMLP) ? "MLP" : "UNKNOWN";

    if (m_true_hd_mode)
    {
        if (isEAC3())
            str << "E";
        str << "AC3 core + ";
        str << hd_type;
        if (mlp.m_substreams == 4)
            str << " + ATMOS";
        str << ". ";

        str << "Peak bitrate: " << mlp.m_bitrate / 1000 << "Kbps (core " << m_bit_rate / 1000 << "Kbps) ";
        str << "Sample Rate: " << mlp.m_samplerate / 1000 << "KHz ";
        if (m_sample_rate != mlp.m_samplerate)
            str << " (core " << m_sample_rate / 1000 << "Khz) ";
    }
    else
    {
        if (isEAC3())
            str << "EAC3 ";
        if (m_isAtmos)
            str << "+ ATMOS, ";

        str << "Bitrate: " << (m_bit_rate + m_bit_rateExt) / 1000 << "Kbps ";
        if (m_bit_rateExt)
            str << "(core " << m_bit_rate / 1000 << "Kbps) ";
        str << "Sample Rate: " << m_sample_rate / 1000 << "KHz ";
    }

    str << "Channels: ";
    int channels = m_channels;
    if (m_extChannelsExists)
        channels += 2;
    if (mlp.m_channels)
        channels = mlp.m_channels;

    if (m_lfeon)
        str << channels - 1 << ".1";
    else
        str << channels;
    return str.str();
}